

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForStatement.cpp
# Opt level: O3

string * __thiscall
ninx::parser::element::ForStatement::dump_abi_cxx11_
          (string *__return_storage_ptr__,ForStatement *this,int level)

{
  Block *pBVar1;
  string *psVar2;
  long *plVar3;
  ostream *poVar4;
  long *plVar5;
  stringstream s;
  long *local_200;
  long local_1f8;
  long local_1f0;
  long lStack_1e8;
  long *local_1e0 [2];
  long local_1d0 [2];
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_1e0[0] = local_1d0;
  std::__cxx11::string::_M_construct((ulong)local_1e0,(char)level);
  local_1c0 = __return_storage_ptr__;
  plVar3 = (long *)std::__cxx11::string::append((char *)local_1e0);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_1f0 = *plVar5;
    lStack_1e8 = plVar3[3];
    local_200 = &local_1f0;
  }
  else {
    local_1f0 = *plVar5;
    local_200 = (long *)*plVar3;
  }
  local_1f8 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_200,local_1f8)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (local_200 != &local_1f0) {
    operator_delete(local_200,local_1f0 + 1);
  }
  if (local_1e0[0] != local_1d0) {
    operator_delete(local_1e0[0],local_1d0[0] + 1);
  }
  local_1e0[0] = local_1d0;
  std::__cxx11::string::_M_construct((ulong)local_1e0,(char)(level + 1));
  plVar3 = (long *)std::__cxx11::string::append((char *)local_1e0);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_1f0 = *plVar5;
    lStack_1e8 = plVar3[3];
    local_200 = &local_1f0;
  }
  else {
    local_1f0 = *plVar5;
    local_200 = (long *)*plVar3;
  }
  local_1f8 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_200,local_1f8)
  ;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(this->iterator_name)._M_dataplus._M_p,
                      (this->iterator_name)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (local_200 != &local_1f0) {
    operator_delete(local_200,local_1f0 + 1);
  }
  if (local_1e0[0] != local_1d0) {
    operator_delete(local_1e0[0],local_1d0[0] + 1);
  }
  pBVar1 = (this->body)._M_t.
           super___uniq_ptr_impl<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
           ._M_t.
           super__Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
           .super__Head_base<0UL,_ninx::parser::element::Block_*,_false>._M_head_impl;
  (**(code **)(*(long *)&(pBVar1->super_Expression).super_Statement + 0x18))
            (&local_200,pBVar1,level + 1);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_200,local_1f8)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (local_200 != &local_1f0) {
    operator_delete(local_200,local_1f0 + 1);
  }
  local_1e0[0] = local_1d0;
  std::__cxx11::string::_M_construct((ulong)local_1e0,(char)level);
  plVar3 = (long *)std::__cxx11::string::append((char *)local_1e0);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_1f0 = *plVar5;
    lStack_1e8 = plVar3[3];
    local_200 = &local_1f0;
  }
  else {
    local_1f0 = *plVar5;
    local_200 = (long *)*plVar3;
  }
  local_1f8 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_200,local_1f8)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (local_200 != &local_1f0) {
    operator_delete(local_200,local_1f0 + 1);
  }
  psVar2 = local_1c0;
  if (local_1e0[0] != local_1d0) {
    operator_delete(local_1e0[0],local_1d0[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar2;
}

Assistant:

std::string ninx::parser::element::ForStatement::dump(int level) const {
    std::stringstream s;

    s << std::string(level, '\t') + "ForStatement {" << std::endl;
    s << std::string(level+1, '\t') + "Iterator: " << iterator_name << std::endl;
    s << this->body->dump(level+1) << std::endl;
    s << std::string(level, '\t') + "}" << std::endl;

    return s.str();
}